

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

void uS::Socket::io_cb<uWS::WebSocket<true>>(uv_poll_t *p,int status,int events)

{
  Queue *this;
  long *plVar1;
  long lVar2;
  uv_poll_t *in_RAX;
  ssize_t sVar3;
  int *piVar4;
  size_t sVar5;
  undefined4 in_register_00000034;
  Socket SVar6;
  Message *pMVar7;
  Socket local_38;
  
  SVar6.p._4_4_ = in_register_00000034;
  SVar6.p._0_4_ = status;
  if (status < 0) {
    uWS::WebSocket<true>::onEnd((WebSocket<true> *)p,SVar6);
    return;
  }
  plVar1 = (long *)p->data;
  lVar2 = *plVar1;
  local_38.p = in_RAX;
  if (((events & 2U) != 0) && (plVar1[4] != 0)) {
    this = (Queue *)(plVar1 + 4);
    local_38.p = p;
    cork(&local_38,1);
    pMVar7 = this->head;
    do {
      SVar6.p = (uv_poll_t *)pMVar7->data;
      sVar3 = send((p->io_watcher).fd,SVar6.p,pMVar7->length,0x4000);
      sVar5 = pMVar7->length - sVar3;
      if (sVar5 != 0) {
        if (sVar3 != -1) {
          pMVar7->length = sVar5;
          pMVar7->data = pMVar7->data + sVar3;
          goto LAB_00115034;
        }
        piVar4 = __errno_location();
        if (*piVar4 == 0xb) goto LAB_00115034;
        goto LAB_00115070;
      }
      if (pMVar7->callback != (_func_void_void_ptr_void_ptr_bool_void_ptr *)0x0) {
        (*pMVar7->callback)(p,pMVar7->callbackData,false,pMVar7->reserved);
      }
      SocketData::Queue::pop(this);
      pMVar7 = this->head;
    } while (pMVar7 != (Message *)0x0);
    *(undefined4 *)(plVar1 + 3) = 1;
    uv_poll_start(p,1,p->poll_cb);
LAB_00115034:
    local_38.p = p;
    cork(&local_38,0);
  }
  if ((events & 1U) != 0) {
    SVar6.p = *(uv_poll_t **)(lVar2 + 8);
    sVar3 = recv((p->io_watcher).fd,SVar6.p,(long)*(int *)(lVar2 + 0x10),0);
    if ((int)sVar3 < 1) {
LAB_00115070:
      uWS::WebSocket<true>::onEnd((WebSocket<true> *)p,SVar6);
    }
    else {
      uWS::WebSocket<true>::onData((Socket)p,*(char **)(lVar2 + 8),(int)sVar3);
    }
  }
  return;
}

Assistant:

static void io_cb(uv_poll_t *p, int status, int events) {
        SocketData *socketData = Socket(p).getSocketData();
        NodeData *nodeData = socketData->nodeData;

        if (status < 0) {
            STATE::onEnd(p);
            return;
        }

        if (events & UV_WRITABLE) {
            if (!socketData->messageQueue.empty() && (events & UV_WRITABLE)) {
                Socket(p).cork(true);
                while (true) {
                    SocketData::Queue::Message *messagePtr = socketData->messageQueue.front();
                    ssize_t sent = ::send(Socket(p).getFd(), messagePtr->data, messagePtr->length, MSG_NOSIGNAL);
                    if (sent == (ssize_t) messagePtr->length) {
                        if (messagePtr->callback) {
                            messagePtr->callback(p, messagePtr->callbackData, false, messagePtr->reserved);
                        }
                        socketData->messageQueue.pop();
                        if (socketData->messageQueue.empty()) {
                            // todo, remove bit, don't set directly
                            socketData->poll = UV_READABLE;
                            uv_poll_start(p, UV_READABLE, Socket(p).getPollCallback());
                            break;
                        }
                    } else if (sent == SOCKET_ERROR) {
                        if (errno != EWOULDBLOCK) {
                            STATE::onEnd(p);
                            return;
                        }
                        break;
                    } else {
                        messagePtr->length -= sent;
                        messagePtr->data += sent;
                        break;
                    }
                }
                Socket(p).cork(false);
            }
        }

        if (events & UV_READABLE) {
            int length = recv(Socket(p).getFd(), nodeData->recvBuffer, nodeData->recvLength, 0);
            if (length > 0) {
                STATE::onData(p, nodeData->recvBuffer, length);
            } else if (length <= 0 || (length == SOCKET_ERROR && errno != EWOULDBLOCK)) {
                STATE::onEnd(p);
            }
        }

    }